

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-lexer.cpp
# Opt level: O1

void __thiscall LexerTest_LexFloat_Test::~LexerTest_LexFloat_Test(LexerTest_LexFloat_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(LexerTest, LexFloat) {
  EXPECT_EQ(Lexer("42"sv).takeF32(), 42.0f);
  EXPECT_EQ(Lexer("42"sv).takeF64(), 42.0);

  EXPECT_EQ(Lexer("42.5"sv).takeF32(), 42.5f);
  EXPECT_EQ(Lexer("42.5"sv).takeF64(), 42.5);

  EXPECT_EQ(Lexer("42e0"sv).takeF32(), 42e0f);
  EXPECT_EQ(Lexer("42e0"sv).takeF64(), 42e0);

  EXPECT_EQ(Lexer("42.e1"sv).takeF32(), 42.e1f);
  EXPECT_EQ(Lexer("42.e1"sv).takeF64(), 42.e1);

  EXPECT_EQ(Lexer("42E1"sv).takeF32(), 42E1f);
  EXPECT_EQ(Lexer("42E1"sv).takeF64(), 42E1);

  EXPECT_EQ(Lexer("42e+2"sv).takeF32(), 42e+2f);
  EXPECT_EQ(Lexer("42e+2"sv).takeF64(), 42e+2);

  EXPECT_EQ(Lexer("42.E-02"sv).takeF32(), 42.E-02f);
  EXPECT_EQ(Lexer("42.E-02"sv).takeF64(), 42.E-02);

  EXPECT_EQ(Lexer("42.0e0"sv).takeF32(), 42.0e0f);
  EXPECT_EQ(Lexer("42.0e0"sv).takeF64(), 42.0e0);

  EXPECT_EQ(Lexer("42.0E1"sv).takeF32(), 42.0E1f);
  EXPECT_EQ(Lexer("42.0E1"sv).takeF64(), 42.0E1);

  EXPECT_EQ(Lexer("42.0e+2"sv).takeF32(), 42.0e+2f);
  EXPECT_EQ(Lexer("42.0e+2"sv).takeF64(), 42.0e+2);

  EXPECT_EQ(Lexer("42.0E-2"sv).takeF32(), 42.0E-2f);
  EXPECT_EQ(Lexer("42.0E-2"sv).takeF64(), 42.0E-2);

  EXPECT_EQ(Lexer("+42.0e+2"sv).takeF32(), +42.0e+2f);
  EXPECT_EQ(Lexer("+42.0e+2"sv).takeF64(), +42.0e+2);

  EXPECT_EQ(Lexer("-42.0e+2"sv).takeF32(), -42.0e+2f);
  EXPECT_EQ(Lexer("-42.0e+2"sv).takeF64(), -42.0e+2);

  EXPECT_EQ(Lexer("4_2.0_0e+0_2"sv).takeF32(), 42.00e+02f);
  EXPECT_EQ(Lexer("4_2.0_0e+0_2"sv).takeF64(), 42.00e+02);

  EXPECT_FALSE(Lexer("+junk"sv).takeF32());
  EXPECT_FALSE(Lexer("+junk"sv).takeF64());

  EXPECT_FALSE(Lexer("42junk"sv).takeF32());
  EXPECT_FALSE(Lexer("42junk"sv).takeF64());

  EXPECT_FALSE(Lexer("42.junk"sv).takeF32());
  EXPECT_FALSE(Lexer("42.junk"sv).takeF64());

  EXPECT_FALSE(Lexer("42.0junk"sv).takeF32());
  EXPECT_FALSE(Lexer("42.0junk"sv).takeF64());

  EXPECT_FALSE(Lexer("42.Ejunk"sv).takeF32());
  EXPECT_FALSE(Lexer("42.Ejunk"sv).takeF64());

  EXPECT_FALSE(Lexer("42.e-junk"sv).takeF32());
  EXPECT_FALSE(Lexer("42.e-junk"sv).takeF64());

  EXPECT_FALSE(Lexer("42.e-10junk"sv).takeF32());
  EXPECT_FALSE(Lexer("42.e-10junk"sv).takeF64());

  EXPECT_FALSE(Lexer("+"sv).takeF32());
  EXPECT_FALSE(Lexer("+"sv).takeF64());

  EXPECT_FALSE(Lexer("42e"sv).takeF32());
  EXPECT_FALSE(Lexer("42e"sv).takeF64());

  EXPECT_FALSE(Lexer("42eABC"sv).takeF32());
  EXPECT_FALSE(Lexer("42eABC"sv).takeF64());

  EXPECT_FALSE(Lexer("42e0xABC"sv).takeF32());
  EXPECT_FALSE(Lexer("42e0xABC"sv).takeF64());

  EXPECT_FALSE(Lexer("+-42"sv).takeF32());
  EXPECT_FALSE(Lexer("+-42"sv).takeF64());

  EXPECT_FALSE(Lexer("-+42"sv).takeF32());
  EXPECT_FALSE(Lexer("-+42"sv).takeF64());

  EXPECT_FALSE(Lexer("42e+-0"sv).takeF32());
  EXPECT_FALSE(Lexer("42e+-0"sv).takeF64());

  EXPECT_FALSE(Lexer("42e-+0"sv).takeF32());
  EXPECT_FALSE(Lexer("42e-+0"sv).takeF64());

  EXPECT_FALSE(Lexer("42p0"sv).takeF32());
  EXPECT_FALSE(Lexer("42p0"sv).takeF64());

  EXPECT_FALSE(Lexer("42P0"sv).takeF32());
  EXPECT_FALSE(Lexer("42P0"sv).takeF64());
}